

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TriangleDerivateCase::~TriangleDerivateCase(TriangleDerivateCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleDerivateCase_01e39350;
  tcu::TestNode::deinit((TestNode *)this);
  std::__cxx11::string::~string((string *)&this->m_fragmentSrc);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

TriangleDerivateCase::~TriangleDerivateCase (void)
{
	TriangleDerivateCase::deinit();
}